

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O0

Amap_Nod_t * Amap_LibCreateObj(Amap_Lib_t *p)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Amap_Nod_t *__s;
  Vec_Int_t *pVVar3;
  Amap_Nod_t *local_20;
  Amap_Nod_t *pNode;
  Amap_Lib_t *p_local;
  
  if (p->nNodes == p->nNodesAlloc) {
    if (p->pNodes == (Amap_Nod_t *)0x0) {
      local_20 = (Amap_Nod_t *)malloc((long)(p->nNodesAlloc << 1) * 0x18);
    }
    else {
      local_20 = (Amap_Nod_t *)realloc(p->pNodes,(long)(p->nNodesAlloc << 1) * 0x18);
    }
    p->pNodes = local_20;
    p->nNodesAlloc = p->nNodesAlloc << 1;
  }
  __s = Amap_LibNod(p,p->nNodes);
  memset(__s,0,0x18);
  uVar1 = p->nNodes;
  p->nNodes = uVar1 + 1;
  *(uint *)__s = *(uint *)__s & 0xffff0000 | uVar1 & 0xffff;
  pVVar2 = p->vRules;
  pVVar3 = Vec_IntAlloc(8);
  Vec_PtrPush(pVVar2,pVVar3);
  pVVar2 = p->vRules;
  pVVar3 = Vec_IntAlloc(8);
  Vec_PtrPush(pVVar2,pVVar3);
  pVVar2 = p->vRulesX;
  pVVar3 = Vec_IntAlloc(8);
  Vec_PtrPush(pVVar2,pVVar3);
  pVVar2 = p->vRulesX;
  pVVar3 = Vec_IntAlloc(8);
  Vec_PtrPush(pVVar2,pVVar3);
  return __s;
}

Assistant:

Amap_Nod_t * Amap_LibCreateObj( Amap_Lib_t * p )
{
    Amap_Nod_t * pNode;
    if ( p->nNodes == p->nNodesAlloc )
    {
        p->pNodes = ABC_REALLOC( Amap_Nod_t, p->pNodes, 2*p->nNodesAlloc );
        p->nNodesAlloc *= 2;
    }
    pNode = Amap_LibNod( p, p->nNodes );
    memset( pNode, 0, sizeof(Amap_Nod_t) );
    pNode->Id = p->nNodes++;
    Vec_PtrPush( p->vRules, Vec_IntAlloc(8) );
    Vec_PtrPush( p->vRules, Vec_IntAlloc(8) );
    Vec_PtrPush( p->vRulesX, Vec_IntAlloc(8) );
    Vec_PtrPush( p->vRulesX, Vec_IntAlloc(8) );
    return pNode;
}